

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_4::Validator::OnSelectExpr(Validator *this,SelectExpr *expr)

{
  Type *result_types;
  Result RVar1;
  
  result_types = (expr->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  RVar1 = SharedValidator::OnSelect
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc,
                     (Index)((ulong)((long)(expr->result_type).
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)result_types) >> 2),result_types);
  RVar1.enum_._0_1_ = RVar1.enum_ == Error || (this->result_).enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  (this->result_).enum_ = RVar1.enum_;
  return (Result)RVar1.enum_;
}

Assistant:

Result Validator::OnSelectExpr(SelectExpr* expr) {
  result_ |= validator_.OnSelect(expr->loc, expr->result_type.size(),
                                 expr->result_type.data());
  // TODO: Existing behavior fails when select fails.
#if 0
  return Result::Ok;
#else
  return result_;
#endif
}